

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options.cc
# Opt level: O2

void usage(int argc,char **argv)

{
  fprintf(_stderr,"Usage: %s [OPTIONS] [FILE...]\n",*argv);
  fwrite("Relay and/or record packet stream.\n",0x23,1,_stderr);
  fputc(10,_stderr);
  fwrite("Options:\n",9,1,_stderr);
  fwrite("      --subscribe ADDR    Address to subscribe to\n",0x32,1,_stderr);
  fwrite("      --publish ADDR      Address to re-publish packets to\n",0x3b,1,_stderr);
  fwrite("      --vcid VCID         Virtual Channel ID to filter\n",0x37,1,_stderr);
  fwrite("                          (can be specified multiple times)\n",0x3c,1,_stderr);
  fputc(10,_stderr);
  fwrite("Record packet stream:\n",0x16,1,_stderr);
  fwrite("      --record            Enable recording of packet stream to disk\n",0x44,1,_stderr);
  fwrite("      --filename PATTERN  Filename pattern for packet files (see strftime(3))\n",0x4e,1,
         _stderr);
  fprintf(_stderr,"                          (default: ./packets-%%FT%%H:%%M:00.raw)\n");
  fputc(10,_stderr);
  fwrite("Other:\n",7,1,_stderr);
  fwrite("      --help     Display this help and exit\n",0x2c,1,_stderr);
  fwrite("      --version  Print version information and exit\n",0x34,1,_stderr);
  fputc(10,_stderr);
  fwrite("If an address to subscribe to is specified,\n",0x2c,1,_stderr);
  fwrite("FILE arguments are ignored.\n",0x1c,1,_stderr);
  fputc(10,_stderr);
  exit(0);
}

Assistant:

void usage(int argc, char** argv) {
  fprintf(stderr, "Usage: %s [OPTIONS] [FILE...]\n", argv[0]);
  fprintf(stderr, "Relay and/or record packet stream.\n");
  fprintf(stderr, "\n");
  fprintf(stderr, "Options:\n");
  fprintf(stderr, "      --subscribe ADDR    Address to subscribe to\n");
  fprintf(stderr, "      --publish ADDR      Address to re-publish packets to\n");
  fprintf(stderr, "      --vcid VCID         Virtual Channel ID to filter\n");
  fprintf(stderr, "                          (can be specified multiple times)\n");
  fprintf(stderr, "\n");
  fprintf(stderr, "Record packet stream:\n");
  fprintf(stderr, "      --record            Enable recording of packet stream to disk\n");
  fprintf(stderr, "      --filename PATTERN  Filename pattern for packet files (see strftime(3))\n");
  fprintf(stderr, "                          (default: ./packets-%%FT%%H:%%M:00.raw)\n");
  fprintf(stderr, "\n");
  fprintf(stderr, "Other:\n");
  fprintf(stderr, "      --help     Display this help and exit\n");
  fprintf(stderr, "      --version  Print version information and exit\n");
  fprintf(stderr, "\n");
  fprintf(stderr, "If an address to subscribe to is specified,\n");
  fprintf(stderr, "FILE arguments are ignored.\n");
  fprintf(stderr, "\n");
  exit(0);
}